

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5Parser.cpp
# Opt level: O1

void __thiscall
Assimp::MD5::MD5CameraParser::MD5CameraParser(MD5CameraParser *this,SectionList *mSections)

{
  string *psVar1;
  pointer *ppCVar2;
  iterator __position;
  pointer pCVar3;
  pointer pEVar4;
  int iVar5;
  Logger *pLVar6;
  ulong uVar7;
  byte *pbVar8;
  ulong in_RCX;
  uint uVar9;
  Element *elem_1;
  pointer pEVar10;
  size_type sVar11;
  Element *elem;
  pointer pSVar12;
  Assimp *pAVar13;
  Assimp *pAVar14;
  CameraAnimFrameDesc local_68;
  pointer local_48;
  pointer local_40;
  pointer local_38;
  
  (this->frames).
  super__Vector_base<Assimp::MD5::CameraAnimFrameDesc,_std::allocator<Assimp::MD5::CameraAnimFrameDesc>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->frames).
  super__Vector_base<Assimp::MD5::CameraAnimFrameDesc,_std::allocator<Assimp::MD5::CameraAnimFrameDesc>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->cuts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->frames).
  super__Vector_base<Assimp::MD5::CameraAnimFrameDesc,_std::allocator<Assimp::MD5::CameraAnimFrameDesc>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cuts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cuts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pLVar6 = DefaultLogger::get();
  Logger::debug(pLVar6,"MD5CameraParser begin");
  this->fFrameRate = 24.0;
  pSVar12 = (mSections->
            super__Vector_base<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>)._M_impl
            .super__Vector_impl_data._M_start;
  local_40 = (mSections->
             super__Vector_base<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>).
             _M_impl.super__Vector_impl_data._M_finish;
  if (pSVar12 != local_40) {
    do {
      psVar1 = &pSVar12->mName;
      iVar5 = std::__cxx11::string::compare((char *)psVar1);
      local_48 = pSVar12;
      if (iVar5 == 0) {
        pbVar8 = (byte *)(pSVar12->mGlobalValue)._M_dataplus._M_p;
        in_RCX = (ulong)*pbVar8;
        if ((byte)(*pbVar8 - 0x3a) < 0xf6) {
          sVar11 = 0;
        }
        else {
          uVar9 = 0;
          do {
            pbVar8 = pbVar8 + 1;
            uVar9 = (uint)(byte)((char)in_RCX - 0x30) + uVar9 * 10;
            in_RCX = (ulong)*pbVar8;
          } while (0xf5 < (byte)(*pbVar8 - 0x3a));
          sVar11 = (size_type)uVar9;
        }
        std::
        vector<Assimp::MD5::CameraAnimFrameDesc,_std::allocator<Assimp::MD5::CameraAnimFrameDesc>_>
        ::reserve(&this->frames,sVar11);
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)psVar1);
        if (iVar5 == 0) {
          local_68.super_BaseFrameDesc.vPositionXYZ._0_8_ =
               local_68.super_BaseFrameDesc.vPositionXYZ._0_8_ & 0xffffffff00000000;
          fast_atoreal_move<float>
                    ((Assimp *)(pSVar12->mGlobalValue)._M_dataplus._M_p,(char *)&local_68,
                     (float *)0x1,SUB81(in_RCX,0));
          this->fFrameRate = local_68.super_BaseFrameDesc.vPositionXYZ.x;
        }
        else {
          iVar5 = std::__cxx11::string::compare((char *)psVar1);
          if (iVar5 == 0) {
            pbVar8 = (byte *)(pSVar12->mGlobalValue)._M_dataplus._M_p;
            in_RCX = (ulong)*pbVar8;
            if ((byte)(*pbVar8 - 0x3a) < 0xf6) {
              sVar11 = 0;
            }
            else {
              uVar9 = 0;
              do {
                pbVar8 = pbVar8 + 1;
                uVar9 = (uint)(byte)((char)in_RCX - 0x30) + uVar9 * 10;
                in_RCX = (ulong)*pbVar8;
              } while (0xf5 < (byte)(*pbVar8 - 0x3a));
              sVar11 = (size_type)uVar9;
            }
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&this->cuts,sVar11);
          }
          else {
            iVar5 = std::__cxx11::string::compare((char *)psVar1);
            if (iVar5 == 0) {
              pEVar4 = (pSVar12->mElements).
                       super__Vector_base<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              for (pEVar10 = (pSVar12->mElements).
                             super__Vector_base<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>
                             ._M_impl.super__Vector_impl_data._M_start; pEVar10 != pEVar4;
                  pEVar10 = pEVar10 + 1) {
                pbVar8 = (byte *)pEVar10->szStart;
                in_RCX = (ulong)*pbVar8;
                iVar5 = 1;
                if (0xf5 < (byte)(*pbVar8 - 0x3a)) {
                  iVar5 = 0;
                  do {
                    pbVar8 = pbVar8 + 1;
                    iVar5 = (uint)(byte)((char)in_RCX - 0x30) + iVar5 * 10;
                    in_RCX = (ulong)*pbVar8;
                  } while (0xf5 < (byte)(*pbVar8 - 0x3a));
                  iVar5 = iVar5 + 1;
                }
                local_68.super_BaseFrameDesc.vPositionXYZ.x = (float)iVar5;
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                          (&this->cuts,(uint *)&local_68);
              }
            }
            else {
              iVar5 = std::__cxx11::string::compare((char *)psVar1);
              if (iVar5 == 0) {
                pEVar10 = (local_48->mElements).
                          super__Vector_base<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                local_38 = (local_48->mElements).
                           super__Vector_base<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                if (pEVar10 != local_38) {
                  do {
                    pAVar13 = (Assimp *)pEVar10->szStart;
                    local_68.super_BaseFrameDesc.vRotationQuat.y = 0.0;
                    local_68.super_BaseFrameDesc.vRotationQuat.z = 0.0;
                    local_68.fFOV = 0.0;
                    local_68.super_BaseFrameDesc.vPositionXYZ.x = 0.0;
                    local_68.super_BaseFrameDesc.vPositionXYZ.y = 0.0;
                    local_68.super_BaseFrameDesc.vPositionXYZ.z = 0.0;
                    local_68.super_BaseFrameDesc.vRotationQuat.x = 0.0;
                    __position._M_current =
                         (this->frames).
                         super__Vector_base<Assimp::MD5::CameraAnimFrameDesc,_std::allocator<Assimp::MD5::CameraAnimFrameDesc>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                    if (__position._M_current ==
                        (this->frames).
                        super__Vector_base<Assimp::MD5::CameraAnimFrameDesc,_std::allocator<Assimp::MD5::CameraAnimFrameDesc>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                      std::
                      vector<Assimp::MD5::CameraAnimFrameDesc,_std::allocator<Assimp::MD5::CameraAnimFrameDesc>_>
                      ::_M_realloc_insert<Assimp::MD5::CameraAnimFrameDesc>
                                (&this->frames,__position,&local_68);
                    }
                    else {
                      ((__position._M_current)->super_BaseFrameDesc).vRotationQuat.x = 0.0;
                      ((__position._M_current)->super_BaseFrameDesc).vRotationQuat.y = 0.0;
                      *(undefined8 *)&((__position._M_current)->super_BaseFrameDesc).vRotationQuat.z
                           = 0;
                      ((__position._M_current)->super_BaseFrameDesc).vPositionXYZ.x = 0.0;
                      ((__position._M_current)->super_BaseFrameDesc).vPositionXYZ.y = 0.0;
                      *(undefined8 *)&((__position._M_current)->super_BaseFrameDesc).vPositionXYZ.z
                           = 0;
                      ppCVar2 = &(this->frames).
                                 super__Vector_base<Assimp::MD5::CameraAnimFrameDesc,_std::allocator<Assimp::MD5::CameraAnimFrameDesc>_>
                                 ._M_impl.super__Vector_impl_data._M_finish;
                      *ppCVar2 = *ppCVar2 + 1;
                    }
                    pCVar3 = (this->frames).
                             super__Vector_base<Assimp::MD5::CameraAnimFrameDesc,_std::allocator<Assimp::MD5::CameraAnimFrameDesc>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                    pAVar14 = pAVar13;
                    while( true ) {
                      pAVar14 = pAVar14 + 1;
                      uVar7 = (ulong)(byte)*pAVar13;
                      if (0x20 < uVar7) break;
                      if ((0x100000200U >> (uVar7 & 0x3f) & 1) == 0) {
                        in_RCX = 0x3401;
                        if ((0x3401UL >> (uVar7 & 0x3f) & 1) != 0) {
                          MD5Parser::ReportWarning("Unexpected end of line",pEVar10->iLineNumber);
                        }
                        break;
                      }
                      pAVar13 = pAVar13 + 1;
                    }
                    if (*pAVar13 != (Assimp)0x28) {
                      MD5Parser::ReportWarning
                                ("Unexpected token: ( was expected",pEVar10->iLineNumber);
                    }
                    for (; uVar7 = (ulong)(byte)*pAVar14, uVar7 < 0x21; pAVar14 = pAVar14 + 1) {
                      if ((0x100000200U >> (uVar7 & 0x3f) & 1) == 0) {
                        in_RCX = 0x3401;
                        if ((0x3401UL >> (uVar7 & 0x3f) & 1) != 0) {
                          MD5Parser::ReportWarning("Unexpected end of line",pEVar10->iLineNumber);
                        }
                        break;
                      }
                    }
                    for (pAVar13 = (Assimp *)
                                   fast_atoreal_move<float>
                                             (pAVar14,(char *)(pCVar3 + -1),(float *)0x1,
                                              SUB81(in_RCX,0)); uVar7 = (ulong)(byte)*pAVar13,
                        uVar7 < 0x21; pAVar13 = pAVar13 + 1) {
                      if ((0x100000200U >> (uVar7 & 0x3f) & 1) == 0) {
                        in_RCX = 0x3401;
                        if ((0x3401UL >> (uVar7 & 0x3f) & 1) != 0) {
                          MD5Parser::ReportWarning("Unexpected end of line",pEVar10->iLineNumber);
                        }
                        break;
                      }
                    }
                    for (pAVar13 = (Assimp *)
                                   fast_atoreal_move<float>
                                             (pAVar13,(char *)&pCVar3[-1].super_BaseFrameDesc.
                                                               vPositionXYZ.y,(float *)0x1,
                                              SUB81(in_RCX,0)); uVar7 = (ulong)(byte)*pAVar13,
                        uVar7 < 0x21; pAVar13 = pAVar13 + 1) {
                      if ((0x100000200U >> (uVar7 & 0x3f) & 1) == 0) {
                        in_RCX = 0x3401;
                        if ((0x3401UL >> (uVar7 & 0x3f) & 1) != 0) {
                          MD5Parser::ReportWarning("Unexpected end of line",pEVar10->iLineNumber);
                        }
                        break;
                      }
                    }
                    pbVar8 = (byte *)fast_atoreal_move<float>
                                               (pAVar13,(char *)&pCVar3[-1].super_BaseFrameDesc.
                                                                 vPositionXYZ.z,(float *)0x1,
                                                SUB81(in_RCX,0));
                    pAVar13 = (Assimp *)(pbVar8 + 2);
                    for (; uVar7 = (ulong)*pbVar8, uVar7 < 0x21; pbVar8 = pbVar8 + 1) {
                      if ((0x100000200U >> (uVar7 & 0x3f) & 1) == 0) {
                        in_RCX = 0x3401;
                        if ((0x3401UL >> (uVar7 & 0x3f) & 1) != 0) {
                          MD5Parser::ReportWarning("Unexpected end of line",pEVar10->iLineNumber);
                        }
                        break;
                      }
                      pAVar13 = pAVar13 + 1;
                    }
                    if (*pbVar8 != 0x29) {
                      MD5Parser::ReportWarning
                                ("Unexpected token: ) was expected",pEVar10->iLineNumber);
                    }
                    for (; uVar7 = (ulong)(byte)pAVar13[-1], uVar7 < 0x21; pAVar13 = pAVar13 + 1) {
                      if ((0x100000200U >> (uVar7 & 0x3f) & 1) == 0) {
                        in_RCX = 0x3401;
                        if ((0x3401UL >> (uVar7 & 0x3f) & 1) != 0) {
                          MD5Parser::ReportWarning("Unexpected end of line",pEVar10->iLineNumber);
                        }
                        break;
                      }
                    }
                    if (pAVar13[-1] != (Assimp)0x28) {
                      MD5Parser::ReportWarning
                                ("Unexpected token: ( was expected",pEVar10->iLineNumber);
                    }
                    for (; uVar7 = (ulong)(byte)*pAVar13, uVar7 < 0x21; pAVar13 = pAVar13 + 1) {
                      if ((0x100000200U >> (uVar7 & 0x3f) & 1) == 0) {
                        in_RCX = 0x3401;
                        if ((0x3401UL >> (uVar7 & 0x3f) & 1) != 0) {
                          MD5Parser::ReportWarning("Unexpected end of line",pEVar10->iLineNumber);
                        }
                        break;
                      }
                    }
                    for (pAVar13 = (Assimp *)
                                   fast_atoreal_move<float>
                                             (pAVar13,(char *)&pCVar3[-1].super_BaseFrameDesc.
                                                               vRotationQuat,(float *)0x1,
                                              SUB81(in_RCX,0)); uVar7 = (ulong)(byte)*pAVar13,
                        uVar7 < 0x21; pAVar13 = pAVar13 + 1) {
                      if ((0x100000200U >> (uVar7 & 0x3f) & 1) == 0) {
                        in_RCX = 0x3401;
                        if ((0x3401UL >> (uVar7 & 0x3f) & 1) != 0) {
                          MD5Parser::ReportWarning("Unexpected end of line",pEVar10->iLineNumber);
                        }
                        break;
                      }
                    }
                    for (pAVar13 = (Assimp *)
                                   fast_atoreal_move<float>
                                             (pAVar13,(char *)&pCVar3[-1].super_BaseFrameDesc.
                                                               vRotationQuat.y,(float *)0x1,
                                              SUB81(in_RCX,0)); uVar7 = (ulong)(byte)*pAVar13,
                        uVar7 < 0x21; pAVar13 = pAVar13 + 1) {
                      if ((0x100000200U >> (uVar7 & 0x3f) & 1) == 0) {
                        in_RCX = 0x3401;
                        if ((0x3401UL >> (uVar7 & 0x3f) & 1) != 0) {
                          MD5Parser::ReportWarning("Unexpected end of line",pEVar10->iLineNumber);
                        }
                        break;
                      }
                    }
                    pAVar14 = (Assimp *)
                              fast_atoreal_move<float>
                                        (pAVar13,(char *)&pCVar3[-1].super_BaseFrameDesc.
                                                          vRotationQuat.z,(float *)0x1,
                                         SUB81(in_RCX,0));
                    pAVar13 = pAVar14;
                    while( true ) {
                      pAVar14 = pAVar14 + 1;
                      uVar7 = (ulong)(byte)*pAVar13;
                      if (0x20 < uVar7) break;
                      if ((0x100000200U >> (uVar7 & 0x3f) & 1) == 0) {
                        in_RCX = 0x3401;
                        if ((0x3401UL >> (uVar7 & 0x3f) & 1) != 0) {
                          MD5Parser::ReportWarning("Unexpected end of line",pEVar10->iLineNumber);
                        }
                        break;
                      }
                      pAVar13 = pAVar13 + 1;
                    }
                    if (*pAVar13 != (Assimp)0x29) {
                      MD5Parser::ReportWarning
                                ("Unexpected token: ) was expected",pEVar10->iLineNumber);
                    }
                    for (; uVar7 = (ulong)(byte)*pAVar14, uVar7 < 0x21; pAVar14 = pAVar14 + 1) {
                      if ((0x100000200U >> (uVar7 & 0x3f) & 1) == 0) {
                        in_RCX = 0x3401;
                        if ((0x3401UL >> (uVar7 & 0x3f) & 1) != 0) {
                          MD5Parser::ReportWarning("Unexpected end of line",pEVar10->iLineNumber);
                        }
                        break;
                      }
                    }
                    local_68.super_BaseFrameDesc.vPositionXYZ._0_8_ =
                         local_68.super_BaseFrameDesc.vPositionXYZ._0_8_ & 0xffffffff00000000;
                    fast_atoreal_move<float>(pAVar14,(char *)&local_68,(float *)0x1,SUB81(in_RCX,0))
                    ;
                    pCVar3[-1].fFOV = local_68.super_BaseFrameDesc.vPositionXYZ.x;
                    pEVar10 = pEVar10 + 1;
                  } while (pEVar10 != local_38);
                }
              }
            }
          }
        }
      }
      pSVar12 = local_48 + 1;
    } while (pSVar12 != local_40);
  }
  pLVar6 = DefaultLogger::get();
  Logger::debug(pLVar6,"MD5CameraParser end");
  return;
}

Assistant:

MD5CameraParser::MD5CameraParser(SectionList& mSections)
{
    ASSIMP_LOG_DEBUG("MD5CameraParser begin");
    fFrameRate = 24.0f;

    for (SectionList::const_iterator iter =  mSections.begin(), iterEnd = mSections.end();iter != iterEnd;++iter) {
        if ((*iter).mName == "numFrames")   {
            frames.reserve(strtoul10((*iter).mGlobalValue.c_str()));
        }
        else if ((*iter).mName == "frameRate")  {
            fFrameRate = fast_atof ((*iter).mGlobalValue.c_str());
        }
        else if ((*iter).mName == "numCuts")    {
            cuts.reserve(strtoul10((*iter).mGlobalValue.c_str()));
        }
        else if ((*iter).mName == "cuts")   {
            for (const auto & elem : (*iter).mElements){
                cuts.push_back(strtoul10(elem.szStart)+1);
            }
        }
        else if ((*iter).mName == "camera") {
            for (const auto & elem : (*iter).mElements){
                const char* sz = elem.szStart;

                frames.push_back(CameraAnimFrameDesc());
                CameraAnimFrameDesc& cur = frames.back();
                AI_MD5_READ_TRIPLE(cur.vPositionXYZ);
                AI_MD5_READ_TRIPLE(cur.vRotationQuat);
                AI_MD5_SKIP_SPACES();
                cur.fFOV = fast_atof(sz);
            }
        }
    }
    ASSIMP_LOG_DEBUG("MD5CameraParser end");
}